

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O2

uint borg_guess_race_name(char *who)

{
  monster_race *pmVar1;
  char **ppcVar2;
  uint *puVar3;
  int *piVar4;
  wchar_t wVar5;
  _Bool _Var6;
  wchar_t wVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  char partial [160];
  
  sVar10 = strlen(who);
  ppcVar2 = borg_unique_text;
  wVar5 = borg_unique_size;
  wVar16 = L'\0';
  while (wVar15 = wVar5, wVar16 < wVar15 + L'\xffffffff') {
    wVar7 = (wVar15 + wVar16) / 2;
    iVar8 = strcmp(ppcVar2[wVar7],who);
    wVar5 = wVar7;
    if (iVar8 < 1) {
      wVar5 = wVar15;
      wVar16 = wVar7;
    }
  }
  iVar8 = strcmp(who,ppcVar2[wVar16]);
  if (iVar8 == 0) {
    uVar14 = borg_unique_what[wVar16];
  }
  else {
    _Var6 = suffix(who," (offscreen)");
    pcVar13 = who;
    if (_Var6) {
      pcVar13 = partial;
      my_strcpy(pcVar13,who,0xa0);
      partial[(int)sVar10 + -0xc] = '\0';
      pcVar11 = format("# Handling offscreen monster (%s)",pcVar13);
      borg_note(pcVar11);
    }
    _Var6 = prefix(pcVar13,"The ");
    if ((_Var6) || (_Var6 = prefix(pcVar13,"the "), _Var6)) {
      ppcVar2 = borg_normal_text;
      pcVar13 = pcVar13 + 4;
      wVar5 = borg_normal_size;
      wVar16 = L'\0';
      while (wVar15 = wVar5, piVar4 = borg.trait, puVar3 = borg_normal_what, pmVar1 = r_info,
            wVar16 < wVar15 + L'\xffffffff') {
        wVar7 = (wVar15 + wVar16) / 2;
        iVar8 = strcmp(ppcVar2[wVar7],pcVar13);
        wVar5 = wVar7;
        if (iVar8 < 1) {
          wVar5 = wVar15;
          wVar16 = wVar7;
        }
      }
      uVar14 = 0;
      iVar8 = 0;
      for (; L'\xffffffff' < wVar16; wVar16 = wVar16 + L'\xffffffff') {
        iVar9 = strcmp(pcVar13,ppcVar2[(uint)wVar16]);
        if (iVar9 != 0) break;
        iVar12 = pmVar1[(int)puVar3[(uint)wVar16]].level - piVar4[0x69];
        iVar9 = -iVar12;
        if (0 < iVar12) {
          iVar9 = iVar12;
        }
        if (uVar14 == 0 || iVar8 <= 1000 - iVar9) {
          uVar14 = puVar3[(uint)wVar16];
          iVar8 = 1000 - iVar9;
        }
      }
      if (uVar14 != 0) {
        return uVar14;
      }
      pcVar11 = "# Assuming player ghost (%s)(b)";
    }
    else {
      pcVar11 = "# Assuming player ghost (%s) (a)";
    }
    pcVar13 = format(pcVar11,pcVar13);
    borg_note(pcVar13);
    uVar14 = z_info->r_max - 1;
  }
  return uVar14;
}

Assistant:

static unsigned int borg_guess_race_name(char *who)
{
    int k, m, n;

    int i, b_i = 0;
    int s, b_s = 0;

    struct monster_race *r_ptr;

    char partial[160];
    int  len = strlen(who);

    /* Start the search */
    m = 0;
    n = borg_unique_size;

    /* Binary search */
    while (m < n - 1) {
        /* Pick a "middle" entry */
        i = (m + n) / 2;

        /* Search to the right (or here) */
        if (strcmp(borg_unique_text[i], who) <= 0) {
            m = i;
        }

        /* Search to the left */
        else {
            n = i;
        }
    }

    /* Check for equality */
    if (streq(who, borg_unique_text[m])) {
        /* Use this monster */
        return (borg_unique_what[m]);
    }

    /* Hack -- handle "offscreen" */
    if (suffix(who, " (offscreen)")) {
        /* Remove the suffix */
        my_strcpy(partial, who, sizeof(partial));
        partial[len - 12] = '\0';
        who               = partial;

        /* Message */
        borg_note(format("# Handling offscreen monster (%s)", who));
    }

    /* Assume player ghost */
    if (!prefix(who, "The ") && !prefix(who, "the ")) {
        /* Message */
        borg_note(format("# Assuming player ghost (%s) (a)", who));

        /* Oops */
        return (z_info->r_max - 1);
    }

    /* Skip the prefix */
    who += 4;

    /* Start the search */
    m = 0;
    n = borg_normal_size;

    /* Binary search */
    while (m < n - 1) {
        /* Pick a "middle" entry */
        i = (m + n) / 2;

        /* Search to the right (or here) */
        if (strcmp(borg_normal_text[i], who) <= 0) {
            m = i;
        }

        /* Search to the left */
        else {
            n = i;
        }
    }

    /* Scan possibilities */
    for (k = m; k >= 0; k--) {
        /* Stop when done */
        if (!streq(who, borg_normal_text[k]))
            break;

        /* Extract the monster */
        i = (int)borg_normal_what[k];

        /* Access the monster */
        r_ptr = &r_info[i];

        /* Basic score */
        s = 1000;

        /* Penalize "depth miss" */
        s = s - ABS(r_ptr->level - borg.trait[BI_CDEPTH]);

        /* Track best */
        if (b_i && (s < b_s))
            continue;

        /* Track it */
        b_i = i;
        b_s = s;
    }

    /* Success */
    if (b_i)
        return ((unsigned int)b_i);

    /* No match found */
    borg_note(format("# Assuming player ghost (%s)(b)", who));

    /* Oops */
    return (z_info->r_max - 1);
}